

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

NFADepartureSet<wchar_t> * __thiscall
Centaurus::NFADepartureSetFactory<wchar_t>::build_departure_set
          (NFADepartureSet<wchar_t> *__return_storage_ptr__,NFADepartureSetFactory<wchar_t> *this)

{
  pointer pNVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  NFATransition<wchar_t> *tr;
  pointer pNVar4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_node_base *p_Var6;
  IndexVector borders_for_one_tr;
  Range<wchar_t> atomic_range;
  set<int,_std::less<int>,_std::allocator<int>_> borders;
  int local_bc;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b8;
  vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_88;
  NFADepartureSetFactory<wchar_t> *local_80;
  _Rb_tree_node_base *local_78;
  Range<wchar_t> local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pNVar4 = (this->m_transitions).
                super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar4 != pNVar1; pNVar4 = pNVar4 + 1) {
    CharClass<wchar_t>::collect_borders((IndexVector *)&local_b8,&pNVar4->m_label);
    __first._M_current._4_4_ = local_b8._M_impl.super__Rb_tree_header._M_header._4_4_;
    __first._M_current._0_4_ = local_b8._M_impl.super__Rb_tree_header._M_header._M_color;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,__first,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                        local_b8._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_b8._M_impl.super__Rb_tree_header);
  }
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = &__return_storage_ptr__->
              super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_vptr_NFADepartureSet = (_func_int **)&PTR__NFADepartureSet_001a0288;
  p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var5 = &local_60._M_impl.super__Rb_tree_header, (_Rb_tree_header *)p_Var6 != p_Var5) {
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    if ((_Rb_tree_header *)p_Var3 == p_Var5) break;
    local_70.m_start = p_Var6[1]._M_color;
    local_70.m_end = p_Var3[1]._M_color;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70._vptr_Range = (_func_int **)&PTR__Range_0019f5b0;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b8._M_impl.super__Rb_tree_header._M_header;
    local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
    pNVar1 = (local_80->m_transitions).
             super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_78 = p_Var3;
    for (pNVar4 = (local_80->m_transitions).
                  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar4 != pNVar1; pNVar4 = pNVar4 + 1)
    {
      bVar2 = CharClass<wchar_t>::includes(&pNVar4->m_label,&local_70);
      if (bVar2) {
        local_bc = pNVar4->m_dest;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_b8,&local_bc);
      }
    }
    if (local_b8._M_impl.super__Rb_tree_header._M_node_count != 0) {
      NFADepartureSet<wchar_t>::add(__return_storage_ptr__,&local_70,(NFAClosure *)&local_b8);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_b8);
    p_Var6 = local_78;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

NFADepartureSet<TCHAR> build_departure_set()
    {
        std::set<int> borders;

        for (const auto& tr : m_transitions)
        {
            IndexVector borders_for_one_tr = tr.label().collect_borders();

            borders.insert(borders_for_one_tr.cbegin(), borders_for_one_tr.cend());
        }

        NFADepartureSet<TCHAR> deptset;

        for (auto i = borders.cbegin(); i != borders.cend();)
        {
            TCHAR atomic_range_start = *i;
            if (++i == borders.cend()) break;
            TCHAR atomic_range_end = *i;

            Range<TCHAR> atomic_range(atomic_range_start, atomic_range_end);

            NFAClosure closure;

            for (const auto& tr : m_transitions)
            {
                if (tr.label().includes(atomic_range))
                {
                    closure.insert(tr.dest());
                }
            }

            if (!closure.empty())
            {
                deptset.add(atomic_range, closure);
            }
        }

        return deptset;
    }